

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O1

void sha1ProcessChunk(Sha1State *state,uchar *buffer)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  quint32 qVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  long lVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  int iVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  long in_FS_OFFSET;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = state->h0;
  uVar3 = state->h1;
  uVar4 = state->h2;
  uVar5 = state->h3;
  qVar6 = state->h4;
  local_48 = *(uint *)(buffer + 0x30);
  uStack_44 = *(uint *)(buffer + 0x34);
  uStack_40 = *(uint *)(buffer + 0x38);
  uStack_3c = *(uint *)(buffer + 0x3c);
  local_58 = *(undefined8 *)(buffer + 0x20);
  uStack_50 = *(undefined8 *)(buffer + 0x28);
  local_68 = *(undefined8 *)(buffer + 0x10);
  uStack_60 = *(undefined8 *)(buffer + 0x18);
  local_78 = *(undefined8 *)buffer;
  uStack_70 = *(undefined8 *)(buffer + 8);
  lVar33 = 0;
  do {
    auVar60 = *(undefined1 (*) [16])((long)&local_78 + lVar33 * 4);
    auVar61[1] = 0;
    auVar61[0] = auVar60[8];
    auVar61[2] = auVar60[9];
    auVar61[3] = 0;
    auVar61[4] = auVar60[10];
    auVar61[5] = 0;
    auVar61[6] = auVar60[0xb];
    auVar61[7] = 0;
    auVar61[8] = auVar60[0xc];
    auVar61[9] = 0;
    auVar61[10] = auVar60[0xd];
    auVar61[0xb] = 0;
    auVar61[0xc] = auVar60[0xe];
    auVar61[0xd] = 0;
    auVar61[0xe] = auVar60[0xf];
    auVar61[0xf] = 0;
    auVar61 = pshuflw(auVar61,auVar61,0x1b);
    auVar61 = pshufhw(auVar61,auVar61,0x1b);
    auVar23[0xd] = 0;
    auVar23._0_13_ = auVar60._0_13_;
    auVar23[0xe] = auVar60[7];
    auVar24[0xc] = auVar60[6];
    auVar24._0_12_ = auVar60._0_12_;
    auVar24._13_2_ = auVar23._13_2_;
    auVar25[0xb] = 0;
    auVar25._0_11_ = auVar60._0_11_;
    auVar25._12_3_ = auVar24._12_3_;
    auVar26[10] = auVar60[5];
    auVar26._0_10_ = auVar60._0_10_;
    auVar26._11_4_ = auVar25._11_4_;
    auVar27[9] = 0;
    auVar27._0_9_ = auVar60._0_9_;
    auVar27._10_5_ = auVar26._10_5_;
    auVar28[8] = auVar60[4];
    auVar28._0_8_ = auVar60._0_8_;
    auVar28._9_6_ = auVar27._9_6_;
    auVar30._7_8_ = 0;
    auVar30._0_7_ = auVar28._8_7_;
    auVar31._1_8_ = SUB158(auVar30 << 0x40,7);
    auVar31[0] = auVar60[3];
    auVar31._9_6_ = 0;
    auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
    auVar32[0] = auVar60[2];
    auVar32._11_4_ = 0;
    auVar29[2] = auVar60[1];
    auVar29._0_2_ = auVar60._0_2_;
    auVar29._3_12_ = SUB1512(auVar32 << 0x20,3);
    auVar60._0_2_ = auVar60._0_2_ & 0xff;
    auVar60._2_13_ = auVar29._2_13_;
    auVar60[0xf] = 0;
    auVar60 = pshuflw(auVar60,auVar60,0x1b);
    auVar60 = pshufhw(auVar60,auVar60,0x1b);
    sVar7 = auVar60._0_2_;
    sVar8 = auVar60._2_2_;
    sVar9 = auVar60._4_2_;
    sVar10 = auVar60._6_2_;
    sVar11 = auVar60._8_2_;
    sVar12 = auVar60._10_2_;
    sVar13 = auVar60._12_2_;
    sVar14 = auVar60._14_2_;
    sVar15 = auVar61._0_2_;
    sVar16 = auVar61._2_2_;
    sVar17 = auVar61._4_2_;
    sVar18 = auVar61._6_2_;
    sVar19 = auVar61._8_2_;
    sVar20 = auVar61._10_2_;
    sVar21 = auVar61._12_2_;
    sVar22 = auVar61._14_2_;
    lVar1 = lVar33 * 4;
    *(char *)((long)&local_78 + lVar1) = (0 < sVar7) * (sVar7 < 0x100) * auVar60[0] - (0xff < sVar7)
    ;
    *(char *)((long)&local_78 + lVar1 + 1) =
         (0 < sVar8) * (sVar8 < 0x100) * auVar60[2] - (0xff < sVar8);
    *(char *)((long)&local_78 + lVar1 + 2) =
         (0 < sVar9) * (sVar9 < 0x100) * auVar60[4] - (0xff < sVar9);
    *(char *)((long)&local_78 + lVar1 + 3) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar60[6] - (0xff < sVar10);
    *(char *)((long)&local_78 + lVar1 + 4) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar60[8] - (0xff < sVar11);
    *(char *)((long)&local_78 + lVar1 + 5) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar60[10] - (0xff < sVar12);
    *(char *)((long)&local_78 + lVar1 + 6) =
         (0 < sVar13) * (sVar13 < 0x100) * auVar60[0xc] - (0xff < sVar13);
    *(char *)((long)&local_78 + lVar1 + 7) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar60[0xe] - (0xff < sVar14);
    *(char *)((long)&uStack_70 + lVar1) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar61[0] - (0xff < sVar15);
    *(char *)((long)&uStack_70 + lVar1 + 1) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar61[2] - (0xff < sVar16);
    *(char *)((long)&uStack_70 + lVar1 + 2) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar61[4] - (0xff < sVar17);
    *(char *)((long)&uStack_70 + lVar1 + 3) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar61[6] - (0xff < sVar18);
    *(char *)((long)&uStack_70 + lVar1 + 4) =
         (0 < sVar19) * (sVar19 < 0x100) * auVar61[8] - (0xff < sVar19);
    *(char *)((long)&uStack_70 + lVar1 + 5) =
         (0 < sVar20) * (sVar20 < 0x100) * auVar61[10] - (0xff < sVar20);
    *(char *)((long)&uStack_70 + lVar1 + 6) =
         (0 < sVar21) * (sVar21 < 0x100) * auVar61[0xc] - (0xff < sVar21);
    *(char *)((long)&uStack_70 + lVar1 + 7) =
         (0 < sVar22) * (sVar22 < 0x100) * auVar61[0xe] - (0xff < sVar22);
    lVar33 = lVar33 + 4;
  } while (lVar33 != 0x10);
  uVar37 = uVar3 << 0x1e | uVar3 >> 2;
  uVar34 = (uVar2 << 5 | uVar2 >> 0x1b) + qVar6 + ((uVar5 ^ uVar4) & uVar3 ^ uVar5) + 0x5a827999 +
           (uint)local_78;
  uVar41 = ((uVar4 ^ uVar37) & uVar2 ^ uVar4) + uVar5 + local_78._4_4_ + 0x5a827999 +
           (uVar34 * 0x20 | uVar34 >> 0x1b);
  uVar50 = uVar2 << 0x1e | uVar2 >> 2;
  uVar35 = uVar34 * 0x40000000 | uVar34 >> 2;
  uVar34 = ((uVar37 ^ uVar50) & uVar34 ^ uVar37) + uVar4 + (uint)uStack_70 + 0x5a827999 +
           (uVar41 * 0x20 | uVar41 >> 0x1b);
  uVar38 = uVar37 + uStack_70._4_4_ + ((uVar35 ^ uVar50) & uVar41 ^ uVar50) + 0x5a827999 +
           (uVar34 * 0x20 | uVar34 >> 0x1b);
  uVar41 = uVar41 * 0x40000000 | uVar41 >> 2;
  uVar37 = uVar34 * 0x40000000 | uVar34 >> 2;
  uVar34 = uVar50 + (uint)local_68 + ((uVar41 ^ uVar35) & uVar34 ^ uVar35) + 0x5a827999 +
           (uVar38 * 0x20 | uVar38 >> 0x1b);
  uVar35 = uVar35 + local_68._4_4_ + ((uVar37 ^ uVar41) & uVar38 ^ uVar41) + 0x5a827999 +
           (uVar34 * 0x20 | uVar34 >> 0x1b);
  uVar38 = uVar38 * 0x40000000 | uVar38 >> 2;
  uVar51 = uVar34 * 0x40000000 | uVar34 >> 2;
  uVar41 = uVar41 + (uint)uStack_60 + ((uVar38 ^ uVar37) & uVar34 ^ uVar37) + 0x5a827999 +
           (uVar35 * 0x20 | uVar35 >> 0x1b);
  uVar34 = uVar37 + uStack_60._4_4_ + ((uVar51 ^ uVar38) & uVar35 ^ uVar38) + 0x5a827999 +
           (uVar41 * 0x20 | uVar41 >> 0x1b);
  uVar37 = uVar35 * 0x40000000 | uVar35 >> 2;
  uVar50 = uVar41 * 0x40000000 | uVar41 >> 2;
  uVar35 = uVar38 + (uint)local_58 + ((uVar37 ^ uVar51) & uVar41 ^ uVar51) + 0x5a827999 +
           (uVar34 * 0x20 | uVar34 >> 0x1b);
  uVar51 = uVar51 + local_58._4_4_ + ((uVar50 ^ uVar37) & uVar34 ^ uVar37) + 0x5a827999 +
           (uVar35 * 0x20 | uVar35 >> 0x1b);
  uVar34 = uVar34 * 0x40000000 | uVar34 >> 2;
  uVar38 = uVar35 * 0x40000000 | uVar35 >> 2;
  uVar37 = uVar37 + (uint)uStack_50 + ((uVar34 ^ uVar50) & uVar35 ^ uVar50) + 0x5a827999 +
           (uVar51 * 0x20 | uVar51 >> 0x1b);
  uVar41 = uVar50 + uStack_50._4_4_ + ((uVar38 ^ uVar34) & uVar51 ^ uVar34) + 0x5a827999 +
           (uVar37 * 0x20 | uVar37 >> 0x1b);
  uVar50 = uVar51 * 0x40000000 | uVar51 >> 2;
  uVar35 = uVar37 * 0x40000000 | uVar37 >> 2;
  uVar34 = uVar34 + local_48 + ((uVar50 ^ uVar38) & uVar37 ^ uVar38) + 0x5a827999 +
           (uVar41 * 0x20 | uVar41 >> 0x1b);
  uVar38 = uVar38 + uStack_44 + ((uVar35 ^ uVar50) & uVar41 ^ uVar50) + 0x5a827999 +
           (uVar34 * 0x20 | uVar34 >> 0x1b);
  uVar41 = uVar41 * 0x40000000 | uVar41 >> 2;
  uVar37 = uVar34 * 0x40000000 | uVar34 >> 2;
  uVar51 = uVar50 + uStack_40 + ((uVar41 ^ uVar35) & uVar34 ^ uVar35) + 0x5a827999 +
           (uVar38 * 0x20 | uVar38 >> 0x1b);
  uVar34 = uVar35 + uStack_3c + ((uVar37 ^ uVar41) & uVar38 ^ uVar41) + 0x5a827999 +
           (uVar51 * 0x20 | uVar51 >> 0x1b);
  uVar35 = (uint)local_58 ^ uStack_44 ^ (uint)local_78 ^ (uint)uStack_70;
  uVar38 = uVar38 * 0x40000000 | uVar38 >> 2;
  uVar47 = uVar35 << 1 | (uint)((int)uVar35 < 0);
  uVar50 = uVar41 + uVar47 + ((uVar38 ^ uVar37) & uVar51 ^ uVar37) + 0x5a827999 +
           (uVar34 * 0x20 | uVar34 >> 0x1b);
  uVar35 = local_58._4_4_ ^ uStack_40 ^ local_78._4_4_ ^ uStack_70._4_4_;
  uVar52 = uVar51 * 0x40000000 | uVar51 >> 2;
  uVar58 = uVar35 << 1 | (uint)((int)uVar35 < 0);
  uVar35 = uVar34 * 0x40000000 | uVar34 >> 2;
  uVar37 = uVar37 + uVar58 + ((uVar52 ^ uVar38) & uVar34 ^ uVar38) + 0x5a827999 +
           (uVar50 * 0x20 | uVar50 >> 0x1b);
  uVar34 = (uint)uStack_50 ^ uStack_3c ^ (uint)uStack_70 ^ (uint)local_68;
  uVar51 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar41 = uVar38 + uVar51 + ((uVar35 ^ uVar52) & uVar50 ^ uVar52) + 0x5a827999 +
           (uVar37 * 0x20 | uVar37 >> 0x1b);
  uVar42 = uVar50 * 0x40000000 | uVar50 >> 2;
  uVar34 = uStack_70._4_4_ ^ local_68._4_4_ ^ uStack_50._4_4_ ^ uVar47;
  uVar36 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar53 = uVar52 + uVar36 + ((uVar42 ^ uVar35) & uVar37 ^ uVar35) + 0x5a827999 +
           (uVar41 * 0x20 | uVar41 >> 0x1b);
  uVar38 = uVar37 * 0x40000000 | uVar37 >> 2;
  uVar34 = (uint)local_68 ^ (uint)uStack_60 ^ local_48 ^ uVar58;
  uVar37 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar50 = uVar35 + uVar37 + (uVar38 ^ uVar42 ^ uVar41) + 0x6ed9eba1 +
           (uVar53 * 0x20 | uVar53 >> 0x1b);
  uVar52 = uVar41 * 0x40000000 | uVar41 >> 2;
  uVar34 = local_68._4_4_ ^ uStack_60._4_4_ ^ uStack_44 ^ uVar51;
  uVar34 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar54 = uVar53 * 0x40000000 | uVar53 >> 2;
  uVar53 = uVar42 + uVar34 + (uVar52 ^ uVar38 ^ uVar53) + 0x6ed9eba1 +
           (uVar50 * 0x20 | uVar50 >> 0x1b);
  uVar35 = (uint)uStack_60 ^ (uint)local_58 ^ uStack_40 ^ uVar36;
  uVar35 = uVar35 << 1 | (uint)((int)uVar35 < 0);
  uVar41 = uVar38 + uVar35 + (uVar54 ^ uVar52 ^ uVar50) + 0x6ed9eba1 +
           (uVar53 * 0x20 | uVar53 >> 0x1b);
  uVar50 = uVar50 * 0x40000000 | uVar50 >> 2;
  uVar38 = uStack_60._4_4_ ^ local_58._4_4_ ^ uStack_3c ^ uVar37;
  uVar38 = uVar38 << 1 | (uint)((int)uVar38 < 0);
  uVar42 = uVar52 + uVar38 + (uVar50 ^ uVar54 ^ uVar53) + 0x6ed9eba1 +
           (uVar41 * 0x20 | uVar41 >> 0x1b);
  uVar53 = uVar53 * 0x40000000 | uVar53 >> 2;
  uVar52 = (uint)local_58 ^ (uint)uStack_50 ^ uVar47 ^ uVar34;
  uVar46 = uVar52 << 1 | (uint)((int)uVar52 < 0);
  uVar54 = uVar54 + uVar46 + (uVar53 ^ uVar50 ^ uVar41) + 0x6ed9eba1 +
           (uVar42 * 0x20 | uVar42 >> 0x1b);
  uVar52 = uVar41 * 0x40000000 | uVar41 >> 2;
  uVar41 = local_58._4_4_ ^ uStack_50._4_4_ ^ uVar58 ^ uVar35;
  uVar41 = uVar41 << 1 | (uint)((int)uVar41 < 0);
  uVar39 = uVar42 * 0x40000000 | uVar42 >> 2;
  uVar42 = uVar50 + uVar41 + (uVar52 ^ uVar53 ^ uVar42) + 0x6ed9eba1 +
           (uVar54 * 0x20 | uVar54 >> 0x1b);
  uVar50 = (uint)uStack_50 ^ local_48 ^ uVar51 ^ uVar38;
  uVar40 = uVar50 << 1 | (uint)((int)uVar50 < 0);
  uVar43 = uVar53 + uVar40 + (uVar39 ^ uVar52 ^ uVar54) + 0x6ed9eba1 +
           (uVar42 * 0x20 | uVar42 >> 0x1b);
  uVar55 = uVar54 * 0x40000000 | uVar54 >> 2;
  uVar50 = uStack_50._4_4_ ^ uStack_44 ^ uVar36 ^ uVar46;
  uVar53 = uVar50 << 1 | (uint)((int)uVar50 < 0);
  uVar52 = uVar52 + uVar53 + (uVar55 ^ uVar39 ^ uVar42) + 0x6ed9eba1 +
           (uVar43 * 0x20 | uVar43 >> 0x1b);
  uVar54 = uVar42 * 0x40000000 | uVar42 >> 2;
  uVar50 = local_48 ^ uStack_40 ^ uVar37 ^ uVar41;
  uVar50 = uVar50 << 1 | (uint)((int)uVar50 < 0);
  uVar39 = uVar39 + uVar50 + (uVar54 ^ uVar55 ^ uVar43) + 0x6ed9eba1 +
           (uVar52 * 0x20 | uVar52 >> 0x1b);
  uVar44 = uVar43 * 0x40000000 | uVar43 >> 2;
  uVar42 = uStack_44 ^ uStack_3c ^ uVar34 ^ uVar40;
  uVar49 = uVar42 << 1 | (uint)((int)uVar42 < 0);
  uVar42 = uVar52 * 0x40000000 | uVar52 >> 2;
  uVar56 = uVar55 + uVar49 + (uVar44 ^ uVar54 ^ uVar52) + 0x6ed9eba1 +
           (uVar39 * 0x20 | uVar39 >> 0x1b);
  uVar52 = uStack_40 ^ uVar47 ^ uVar35 ^ uVar53;
  uVar52 = uVar52 << 1 | (uint)((int)uVar52 < 0);
  uVar54 = uVar54 + uVar52 + (uVar42 ^ uVar44 ^ uVar39) + 0x6ed9eba1 +
           (uVar56 * 0x20 | uVar56 >> 0x1b);
  uVar55 = uVar39 * 0x40000000 | uVar39 >> 2;
  uVar39 = uStack_3c ^ uVar58 ^ uVar38 ^ uVar50;
  uVar43 = uVar39 << 1 | (uint)((int)uVar39 < 0);
  uVar45 = uVar44 + uVar43 + (uVar55 ^ uVar42 ^ uVar56) + 0x6ed9eba1 +
           (uVar54 * 0x20 | uVar54 >> 0x1b);
  uVar57 = uVar56 * 0x40000000 | uVar56 >> 2;
  uVar39 = uVar47 ^ uVar51 ^ uVar46 ^ uVar49;
  uVar56 = uVar39 << 1 | (uint)((int)uVar39 < 0);
  uVar42 = uVar42 + uVar56 + (uVar57 ^ uVar55 ^ uVar54) + 0x6ed9eba1 +
           (uVar45 * 0x20 | uVar45 >> 0x1b);
  uVar39 = uVar54 * 0x40000000 | uVar54 >> 2;
  uVar54 = uVar58 ^ uVar36 ^ uVar41 ^ uVar52;
  uVar59 = uVar54 << 1 | (uint)((int)uVar54 < 0);
  uVar44 = uVar55 + uVar59 + (uVar39 ^ uVar57 ^ uVar45) + 0x6ed9eba1 +
           (uVar42 * 0x20 | uVar42 >> 0x1b);
  uVar45 = uVar45 * 0x40000000 | uVar45 >> 2;
  uVar51 = uVar51 ^ uVar37 ^ uVar40 ^ uVar43;
  uVar55 = uVar51 << 1 | (uint)((int)uVar51 < 0);
  uVar47 = uVar57 + uVar55 + (uVar45 ^ uVar39 ^ uVar42) + 0x6ed9eba1 +
           (uVar44 * 0x20 | uVar44 >> 0x1b);
  uVar42 = uVar42 * 0x40000000 | uVar42 >> 2;
  uVar51 = uVar36 ^ uVar34 ^ uVar53 ^ uVar56;
  uVar54 = uVar51 << 1 | (uint)((int)uVar51 < 0);
  uVar36 = uVar39 + uVar54 + (uVar42 ^ uVar45 ^ uVar44) + 0x6ed9eba1 +
           (uVar47 * 0x20 | uVar47 >> 0x1b);
  uVar44 = uVar44 * 0x40000000 | uVar44 >> 2;
  uVar37 = uVar37 ^ uVar35 ^ uVar50 ^ uVar59;
  uVar37 = uVar37 << 1 | (uint)((int)uVar37 < 0);
  uVar45 = uVar45 + uVar37 + (uVar44 ^ uVar42 ^ uVar47) + 0x6ed9eba1 +
           (uVar36 * 0x20 | uVar36 >> 0x1b);
  uVar47 = uVar47 * 0x40000000 | uVar47 >> 2;
  uVar34 = uVar34 ^ uVar38 ^ uVar49 ^ uVar55;
  uVar51 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar39 = uVar42 + uVar51 + (uVar47 ^ uVar44 ^ uVar36) + 0x6ed9eba1 +
           (uVar45 * 0x20 | uVar45 >> 0x1b);
  uVar36 = uVar36 * 0x40000000 | uVar36 >> 2;
  uVar34 = uVar35 ^ uVar46 ^ uVar52 ^ uVar54;
  uVar42 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar44 = uVar44 + uVar42 + (uVar36 ^ uVar47 ^ uVar45) + 0x6ed9eba1 +
           (uVar39 * 0x20 | uVar39 >> 0x1b);
  uVar45 = uVar45 * 0x40000000 | uVar45 >> 2;
  uVar34 = uVar38 ^ uVar41 ^ uVar43 ^ uVar37;
  uVar35 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar47 = uVar47 + uVar35 + (uVar45 ^ uVar36 ^ uVar39) + 0x6ed9eba1 +
           (uVar44 * 0x20 | uVar44 >> 0x1b);
  uVar38 = uVar39 * 0x40000000 | uVar39 >> 2;
  uVar34 = uVar46 ^ uVar40 ^ uVar56 ^ uVar51;
  uVar46 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar39 = uVar36 + uVar46 + (uVar44 & uVar38 | (uVar44 | uVar38) & uVar45) + -0x70e44324 +
           (uVar47 * 0x20 | uVar47 >> 0x1b);
  uVar44 = uVar44 * 0x40000000 | uVar44 >> 2;
  uVar34 = uVar41 ^ uVar53 ^ uVar59 ^ uVar42;
  uVar36 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar45 = uVar45 + uVar36 + (uVar47 & uVar44 | (uVar47 | uVar44) & uVar38) + -0x70e44324 +
           (uVar39 * 0x20 | uVar39 >> 0x1b);
  uVar57 = uVar47 * 0x40000000 | uVar47 >> 2;
  uVar34 = uVar40 ^ uVar50 ^ uVar55 ^ uVar35;
  uVar41 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar38 = uVar38 + uVar41 + (uVar39 & uVar57 | (uVar39 | uVar57) & uVar44) + -0x70e44324 +
           (uVar45 * 0x20 | uVar45 >> 0x1b);
  uVar39 = uVar39 * 0x40000000 | uVar39 >> 2;
  uVar34 = uVar53 ^ uVar49 ^ uVar54 ^ uVar46;
  uVar47 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar44 = uVar44 + uVar47 + (uVar45 & uVar39 | (uVar45 | uVar39) & uVar57) + -0x70e44324 +
           (uVar38 * 0x20 | uVar38 >> 0x1b);
  uVar45 = uVar45 * 0x40000000 | uVar45 >> 2;
  uVar34 = uVar50 ^ uVar52 ^ uVar37 ^ uVar36;
  uVar34 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar50 = uVar57 + uVar34 + (uVar38 & uVar45 | (uVar38 | uVar45) & uVar39) + -0x70e44324 +
           (uVar44 * 0x20 | uVar44 >> 0x1b);
  uVar53 = uVar38 * 0x40000000 | uVar38 >> 2;
  uVar38 = uVar49 ^ uVar43 ^ uVar51 ^ uVar41;
  uVar57 = uVar38 << 1 | (uint)((int)uVar38 < 0);
  uVar39 = uVar39 + uVar57 + (uVar44 & uVar53 | (uVar44 | uVar53) & uVar45) + -0x70e44324 +
           (uVar50 * 0x20 | uVar50 >> 0x1b);
  uVar44 = uVar44 * 0x40000000 | uVar44 >> 2;
  uVar38 = uVar52 ^ uVar56 ^ uVar42 ^ uVar47;
  uVar40 = uVar38 << 1 | (uint)((int)uVar38 < 0);
  uVar45 = uVar45 + uVar40 + (uVar50 & uVar44 | (uVar50 | uVar44) & uVar53) + -0x70e44324 +
           (uVar39 * 0x20 | uVar39 >> 0x1b);
  uVar58 = uVar50 * 0x40000000 | uVar50 >> 2;
  uVar38 = uVar43 ^ uVar59 ^ uVar35 ^ uVar34;
  uVar50 = uVar38 << 1 | (uint)((int)uVar38 < 0);
  uVar38 = uVar53 + uVar50 + (uVar39 & uVar58 | (uVar39 | uVar58) & uVar44) + -0x70e44324 +
           (uVar45 * 0x20 | uVar45 >> 0x1b);
  uVar52 = uVar39 * 0x40000000 | uVar39 >> 2;
  uVar53 = uVar56 ^ uVar55 ^ uVar46 ^ uVar57;
  uVar49 = uVar53 << 1 | (uint)((int)uVar53 < 0);
  uVar39 = uVar44 + uVar49 + (uVar45 & uVar52 | (uVar45 | uVar52) & uVar58) + -0x70e44324 +
           (uVar38 * 0x20 | uVar38 >> 0x1b);
  uVar45 = uVar45 * 0x40000000 | uVar45 >> 2;
  uVar53 = uVar59 ^ uVar54 ^ uVar36 ^ uVar40;
  uVar59 = uVar53 << 1 | (uint)((int)uVar53 < 0);
  uVar56 = uVar58 + uVar59 + (uVar38 & uVar45 | (uVar38 | uVar45) & uVar52) + -0x70e44324 +
           (uVar39 * 0x20 | uVar39 >> 0x1b);
  uVar38 = uVar38 * 0x40000000 | uVar38 >> 2;
  uVar53 = uVar55 ^ uVar37 ^ uVar41 ^ uVar50;
  uVar43 = uVar53 << 1 | (uint)((int)uVar53 < 0);
  uVar52 = uVar52 + uVar43 + (uVar39 & uVar38 | (uVar39 | uVar38) & uVar45) + -0x70e44324 +
           (uVar56 * 0x20 | uVar56 >> 0x1b);
  uVar53 = uVar39 * 0x40000000 | uVar39 >> 2;
  uVar54 = uVar54 ^ uVar51 ^ uVar47 ^ uVar49;
  uVar44 = uVar54 << 1 | (uint)((int)uVar54 < 0);
  uVar39 = uVar45 + uVar44 + (uVar56 & uVar53 | (uVar56 | uVar53) & uVar38) + -0x70e44324 +
           (uVar52 * 0x20 | uVar52 >> 0x1b);
  uVar45 = uVar56 * 0x40000000 | uVar56 >> 2;
  uVar37 = uVar37 ^ uVar42 ^ uVar34 ^ uVar59;
  uVar56 = uVar37 << 1 | (uint)((int)uVar37 < 0);
  uVar38 = uVar38 + uVar56 + (uVar52 & uVar45 | (uVar52 | uVar45) & uVar53) + -0x70e44324 +
           (uVar39 * 0x20 | uVar39 >> 0x1b);
  uVar54 = uVar52 * 0x40000000 | uVar52 >> 2;
  uVar37 = uVar51 ^ uVar35 ^ uVar57 ^ uVar43;
  uVar52 = uVar37 << 1 | (uint)((int)uVar37 < 0);
  uVar51 = uVar53 + uVar52 + (uVar39 & uVar54 | (uVar39 | uVar54) & uVar45) + -0x70e44324 +
           (uVar38 * 0x20 | uVar38 >> 0x1b);
  uVar55 = uVar39 * 0x40000000 | uVar39 >> 2;
  uVar37 = uVar42 ^ uVar46 ^ uVar40 ^ uVar44;
  uVar37 = uVar37 << 1 | (uint)((int)uVar37 < 0);
  uVar42 = uVar45 + uVar37 + (uVar38 & uVar55 | (uVar38 | uVar55) & uVar54) + -0x70e44324 +
           (uVar51 * 0x20 | uVar51 >> 0x1b);
  uVar53 = uVar38 * 0x40000000 | uVar38 >> 2;
  uVar35 = uVar35 ^ uVar36 ^ uVar50 ^ uVar56;
  uVar35 = uVar35 << 1 | (uint)((int)uVar35 < 0);
  uVar54 = uVar54 + uVar35 + (uVar51 & uVar53 | (uVar51 | uVar53) & uVar55) + -0x70e44324 +
           (uVar42 * 0x20 | uVar42 >> 0x1b);
  uVar39 = uVar51 * 0x40000000 | uVar51 >> 2;
  uVar38 = uVar46 ^ uVar41 ^ uVar49 ^ uVar52;
  uVar38 = uVar38 << 1 | (uint)((int)uVar38 < 0);
  uVar55 = uVar55 + uVar38 + (uVar42 & uVar39 | (uVar42 | uVar39) & uVar53) + -0x70e44324 +
           (uVar54 * 0x20 | uVar54 >> 0x1b);
  uVar58 = uVar42 * 0x40000000 | uVar42 >> 2;
  uVar51 = uVar36 ^ uVar47 ^ uVar59 ^ uVar37;
  uVar42 = uVar51 << 1 | (uint)((int)uVar51 < 0);
  uVar51 = uVar53 + uVar42 + (uVar54 & uVar58 | (uVar54 | uVar58) & uVar39) + -0x70e44324 +
           (uVar55 * 0x20 | uVar55 >> 0x1b);
  uVar54 = uVar54 * 0x40000000 | uVar54 >> 2;
  uVar41 = uVar41 ^ uVar34 ^ uVar43 ^ uVar35;
  uVar53 = uVar41 << 1 | (uint)((int)uVar41 < 0);
  uVar39 = uVar39 + uVar53 + (uVar55 & uVar54 | (uVar55 | uVar54) & uVar58) + -0x70e44324 +
           (uVar51 * 0x20 | uVar51 >> 0x1b);
  uVar45 = uVar55 * 0x40000000 | uVar55 >> 2;
  uVar41 = uVar47 ^ uVar57 ^ uVar44 ^ uVar38;
  uVar46 = uVar41 << 1 | (uint)((int)uVar41 < 0);
  uVar47 = uVar58 + uVar46 + (uVar51 & uVar45 | (uVar51 | uVar45) & uVar54) + -0x70e44324 +
           (uVar39 * 0x20 | uVar39 >> 0x1b);
  uVar41 = uVar51 * 0x40000000 | uVar51 >> 2;
  uVar34 = uVar34 ^ uVar40 ^ uVar56 ^ uVar42;
  uVar36 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar55 = uVar39 * 0x40000000 | uVar39 >> 2;
  uVar54 = uVar54 + uVar36 + (uVar41 ^ uVar45 ^ uVar39) + -0x359d3e2a +
           (uVar47 * 0x20 | uVar47 >> 0x1b);
  uVar34 = uVar57 ^ uVar50 ^ uVar52 ^ uVar53;
  uVar57 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar39 = uVar45 + uVar57 + (uVar55 ^ uVar41 ^ uVar47) + -0x359d3e2a +
           (uVar54 * 0x20 | uVar54 >> 0x1b);
  uVar45 = uVar47 * 0x40000000 | uVar47 >> 2;
  uVar34 = uVar40 ^ uVar49 ^ uVar37 ^ uVar46;
  uVar51 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar41 = uVar41 + uVar51 + (uVar45 ^ uVar55 ^ uVar54) + -0x359d3e2a +
           (uVar39 * 0x20 | uVar39 >> 0x1b);
  uVar54 = uVar54 * 0x40000000 | uVar54 >> 2;
  uVar34 = uVar50 ^ uVar59 ^ uVar35 ^ uVar36;
  uVar34 = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar55 = uVar55 + uVar34 + (uVar54 ^ uVar45 ^ uVar39) + -0x359d3e2a +
           (uVar41 * 0x20 | uVar41 >> 0x1b);
  uVar40 = uVar39 * 0x40000000 | uVar39 >> 2;
  uVar50 = uVar49 ^ uVar43 ^ uVar38 ^ uVar57;
  uVar47 = uVar50 << 1 | (uint)((int)uVar50 < 0);
  uVar50 = uVar41 * 0x40000000 | uVar41 >> 2;
  uVar45 = uVar45 + uVar47 + (uVar40 ^ uVar54 ^ uVar41) + -0x359d3e2a +
           (uVar55 * 0x20 | uVar55 >> 0x1b);
  uVar41 = uVar59 ^ uVar44 ^ uVar42 ^ uVar51;
  uVar58 = uVar41 << 1 | (uint)((int)uVar41 < 0);
  uVar39 = uVar54 + uVar58 + (uVar50 ^ uVar40 ^ uVar55) + -0x359d3e2a +
           (uVar45 * 0x20 | uVar45 >> 0x1b);
  uVar55 = uVar55 * 0x40000000 | uVar55 >> 2;
  uVar41 = uVar43 ^ uVar56 ^ uVar53 ^ uVar34;
  uVar43 = uVar41 << 1 | (uint)((int)uVar41 < 0);
  uVar40 = uVar40 + uVar43 + (uVar55 ^ uVar50 ^ uVar45) + -0x359d3e2a +
           (uVar39 * 0x20 | uVar39 >> 0x1b);
  uVar49 = uVar45 * 0x40000000 | uVar45 >> 2;
  uVar41 = uVar44 ^ uVar52 ^ uVar46 ^ uVar47;
  uVar41 = uVar41 << 1 | (uint)((int)uVar41 < 0);
  uVar54 = uVar50 + uVar41 + (uVar49 ^ uVar55 ^ uVar39) + -0x359d3e2a +
           (uVar40 * 0x20 | uVar40 >> 0x1b);
  uVar39 = uVar39 * 0x40000000 | uVar39 >> 2;
  uVar50 = uVar56 ^ uVar37 ^ uVar36 ^ uVar58;
  uVar45 = uVar50 << 1 | (uint)((int)uVar50 < 0);
  uVar44 = uVar40 * 0x40000000 | uVar40 >> 2;
  uVar55 = uVar55 + uVar45 + (uVar39 ^ uVar49 ^ uVar40) + -0x359d3e2a +
           (uVar54 * 0x20 | uVar54 >> 0x1b);
  uVar50 = uVar52 ^ uVar35 ^ uVar57 ^ uVar43;
  uVar50 = uVar50 << 1 | (uint)((int)uVar50 < 0);
  uVar56 = uVar49 + uVar50 + (uVar44 ^ uVar39 ^ uVar54) + -0x359d3e2a +
           (uVar55 * 0x20 | uVar55 >> 0x1b);
  uVar52 = uVar54 * 0x40000000 | uVar54 >> 2;
  uVar37 = uVar37 ^ uVar38 ^ uVar51 ^ uVar41;
  uVar37 = uVar37 << 1 | (uint)((int)uVar37 < 0);
  uVar54 = uVar39 + uVar37 + (uVar52 ^ uVar44 ^ uVar55) + -0x359d3e2a +
           (uVar56 * 0x20 | uVar56 >> 0x1b);
  uVar55 = uVar55 * 0x40000000 | uVar55 >> 2;
  uVar35 = uVar35 ^ uVar42 ^ uVar34 ^ uVar45;
  uVar40 = uVar35 << 1 | (uint)((int)uVar35 < 0);
  uVar44 = uVar44 + uVar40 + (uVar55 ^ uVar52 ^ uVar56) + -0x359d3e2a +
           (uVar54 * 0x20 | uVar54 >> 0x1b);
  uVar56 = uVar56 * 0x40000000 | uVar56 >> 2;
  uVar35 = uVar38 ^ uVar53 ^ uVar47 ^ uVar50;
  uVar35 = uVar35 << 1 | (uint)((int)uVar35 < 0);
  uVar39 = uVar54 * 0x40000000 | uVar54 >> 2;
  uVar52 = uVar52 + uVar35 + (uVar56 ^ uVar55 ^ uVar54) + -0x359d3e2a +
           (uVar44 * 0x20 | uVar44 >> 0x1b);
  uVar38 = uVar42 ^ uVar46 ^ uVar58 ^ uVar37;
  uVar38 = uVar38 << 1 | (uint)((int)uVar38 < 0);
  uVar42 = uVar55 + uVar38 + (uVar39 ^ uVar56 ^ uVar44) + -0x359d3e2a +
           (uVar52 * 0x20 | uVar52 >> 0x1b);
  local_78 = CONCAT44(uVar58,uVar47);
  uVar55 = uVar44 * 0x40000000 | uVar44 >> 2;
  uVar53 = uVar53 ^ uVar36 ^ uVar43 ^ uVar40;
  uVar53 = uVar53 << 1 | (uint)((int)uVar53 < 0);
  uVar44 = uVar56 + uVar53 + (uVar55 ^ uVar39 ^ uVar52) + -0x359d3e2a +
           (uVar42 * 0x20 | uVar42 >> 0x1b);
  uStack_70 = CONCAT44(uVar41,uVar43);
  local_68 = CONCAT44(uVar50,uVar45);
  uStack_60 = CONCAT44(uVar40,uVar37);
  uVar54 = uVar46 ^ uVar57 ^ uVar41 ^ uVar35;
  uVar41 = uVar52 * 0x40000000 | uVar52 >> 2;
  uVar54 = uVar54 << 1 | (uint)((int)uVar54 < 0);
  uVar52 = uVar39 + uVar54 + (uVar41 ^ uVar55 ^ uVar42) + -0x359d3e2a +
           (uVar44 * 0x20 | uVar44 >> 0x1b);
  local_58 = CONCAT44(uVar38,uVar35);
  uVar35 = uVar42 * 0x40000000 | uVar42 >> 2;
  uVar38 = uVar36 ^ uVar51 ^ uVar45 ^ uVar38;
  local_48 = uVar38 << 1 | (uint)((int)uVar38 < 0);
  uVar38 = uVar55 + local_48 + (uVar35 ^ uVar41 ^ uVar44) + -0x359d3e2a +
           (uVar52 * 0x20 | uVar52 >> 0x1b);
  uVar50 = uVar57 ^ uVar34 ^ uVar50 ^ uVar53;
  uStack_50 = CONCAT44(uVar54,uVar53);
  uVar42 = uVar44 * 0x40000000 | uVar44 >> 2;
  uStack_44 = uVar50 << 1 | (uint)((int)uVar50 < 0);
  uVar41 = uStack_44 + uVar41 + (uVar42 ^ uVar35 ^ uVar52) + -0x359d3e2a +
           (uVar38 * 0x20 | uVar38 >> 0x1b);
  uVar54 = uVar47 ^ uVar51 ^ uVar37 ^ uVar54;
  uStack_40 = uVar54 << 1 | (uint)((int)uVar54 < 0);
  uVar37 = uVar52 * 0x40000000 | uVar52 >> 2;
  iVar48 = uStack_40 + uVar35 + (uVar37 ^ uVar42 ^ uVar38) + (uVar41 * 0x20 | uVar41 >> 0x1b);
  uVar34 = uVar58 ^ uVar34 ^ uVar40 ^ local_48;
  uStack_3c = uVar34 << 1 | (uint)((int)uVar34 < 0);
  uVar35 = uVar38 * 0x40000000 | uVar38 >> 2;
  uVar34 = iVar48 + 0xca62c1d6;
  state->h0 = uStack_3c + uVar2 + uVar42 + (uVar35 ^ uVar37 ^ uVar41) + -0x359d3e2a +
              (uVar34 * 0x20 | uVar34 >> 0x1b);
  state->h1 = uVar3 + iVar48 + 0xca62c1d6;
  state->h2 = (uVar41 * 0x40000000 | uVar41 >> 2) + uVar4;
  state->h3 = uVar35 + uVar5;
  state->h4 = uVar37 + qVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void sha1ProcessChunk(Sha1State *state, const unsigned char *buffer)
{
    // Copy state[] to working vars
    quint32 a = state->h0;
    quint32 b = state->h1;
    quint32 c = state->h2;
    quint32 d = state->h3;
    quint32 e = state->h4;

    quint8 chunkBuffer[64];
    memcpy(chunkBuffer, buffer, 64);

    Sha1Chunk *chunk = reinterpret_cast<Sha1Chunk*>(&chunkBuffer);

    for (int i = 0; i < 16; ++i)
        chunk->words[i] = qFromBigEndian(chunk->words[i]);

    sha1Round0(chunk,  0, a,b,c,d,e); sha1Round0(chunk,  1, e,a,b,c,d); sha1Round0(chunk,  2, d,e,a,b,c); sha1Round0(chunk,  3, c,d,e,a,b);
    sha1Round0(chunk,  4, b,c,d,e,a); sha1Round0(chunk,  5, a,b,c,d,e); sha1Round0(chunk,  6, e,a,b,c,d); sha1Round0(chunk,  7, d,e,a,b,c);
    sha1Round0(chunk,  8, c,d,e,a,b); sha1Round0(chunk,  9, b,c,d,e,a); sha1Round0(chunk, 10, a,b,c,d,e); sha1Round0(chunk, 11, e,a,b,c,d);
    sha1Round0(chunk, 12, d,e,a,b,c); sha1Round0(chunk, 13, c,d,e,a,b); sha1Round0(chunk, 14, b,c,d,e,a); sha1Round0(chunk, 15, a,b,c,d,e);
    sha1Round1(chunk, 16, e,a,b,c,d); sha1Round1(chunk, 17, d,e,a,b,c); sha1Round1(chunk, 18, c,d,e,a,b); sha1Round1(chunk, 19, b,c,d,e,a);
    sha1Round2(chunk, 20, a,b,c,d,e); sha1Round2(chunk, 21, e,a,b,c,d); sha1Round2(chunk, 22, d,e,a,b,c); sha1Round2(chunk, 23, c,d,e,a,b);
    sha1Round2(chunk, 24, b,c,d,e,a); sha1Round2(chunk, 25, a,b,c,d,e); sha1Round2(chunk, 26, e,a,b,c,d); sha1Round2(chunk, 27, d,e,a,b,c);
    sha1Round2(chunk, 28, c,d,e,a,b); sha1Round2(chunk, 29, b,c,d,e,a); sha1Round2(chunk, 30, a,b,c,d,e); sha1Round2(chunk, 31, e,a,b,c,d);
    sha1Round2(chunk, 32, d,e,a,b,c); sha1Round2(chunk, 33, c,d,e,a,b); sha1Round2(chunk, 34, b,c,d,e,a); sha1Round2(chunk, 35, a,b,c,d,e);
    sha1Round2(chunk, 36, e,a,b,c,d); sha1Round2(chunk, 37, d,e,a,b,c); sha1Round2(chunk, 38, c,d,e,a,b); sha1Round2(chunk, 39, b,c,d,e,a);
    sha1Round3(chunk, 40, a,b,c,d,e); sha1Round3(chunk, 41, e,a,b,c,d); sha1Round3(chunk, 42, d,e,a,b,c); sha1Round3(chunk, 43, c,d,e,a,b);
    sha1Round3(chunk, 44, b,c,d,e,a); sha1Round3(chunk, 45, a,b,c,d,e); sha1Round3(chunk, 46, e,a,b,c,d); sha1Round3(chunk, 47, d,e,a,b,c);
    sha1Round3(chunk, 48, c,d,e,a,b); sha1Round3(chunk, 49, b,c,d,e,a); sha1Round3(chunk, 50, a,b,c,d,e); sha1Round3(chunk, 51, e,a,b,c,d);
    sha1Round3(chunk, 52, d,e,a,b,c); sha1Round3(chunk, 53, c,d,e,a,b); sha1Round3(chunk, 54, b,c,d,e,a); sha1Round3(chunk, 55, a,b,c,d,e);
    sha1Round3(chunk, 56, e,a,b,c,d); sha1Round3(chunk, 57, d,e,a,b,c); sha1Round3(chunk, 58, c,d,e,a,b); sha1Round3(chunk, 59, b,c,d,e,a);
    sha1Round4(chunk, 60, a,b,c,d,e); sha1Round4(chunk, 61, e,a,b,c,d); sha1Round4(chunk, 62, d,e,a,b,c); sha1Round4(chunk, 63, c,d,e,a,b);
    sha1Round4(chunk, 64, b,c,d,e,a); sha1Round4(chunk, 65, a,b,c,d,e); sha1Round4(chunk, 66, e,a,b,c,d); sha1Round4(chunk, 67, d,e,a,b,c);
    sha1Round4(chunk, 68, c,d,e,a,b); sha1Round4(chunk, 69, b,c,d,e,a); sha1Round4(chunk, 70, a,b,c,d,e); sha1Round4(chunk, 71, e,a,b,c,d);
    sha1Round4(chunk, 72, d,e,a,b,c); sha1Round4(chunk, 73, c,d,e,a,b); sha1Round4(chunk, 74, b,c,d,e,a); sha1Round4(chunk, 75, a,b,c,d,e);
    sha1Round4(chunk, 76, e,a,b,c,d); sha1Round4(chunk, 77, d,e,a,b,c); sha1Round4(chunk, 78, c,d,e,a,b); sha1Round4(chunk, 79, b,c,d,e,a);

    // Add the working vars back into state
    state->h0 += a;
    state->h1 += b;
    state->h2 += c;
    state->h3 += d;
    state->h4 += e;

    // Wipe variables
#ifdef SHA1_WIPE_VARIABLES
    a = b = c = d = e = 0;
    memset(chunkBuffer, 0, 64);
#endif
}